

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O3

format_arg * __thiscall
fmt::v6::
basic_format_args<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>
::do_get(format_arg *__return_storage_ptr__,
        basic_format_args<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>
        *this,int index)

{
  size_t sVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  
  (__return_storage_ptr__->value_).field_0.int_value = 0;
  __return_storage_ptr__->type_ = none_type;
  uVar4 = *(ulong *)this;
  if ((long)uVar4 < 0) {
    if ((int)uVar4 <= index) {
      return __return_storage_ptr__;
    }
    lVar2 = *(long *)(this + 8);
    lVar3 = (long)index * 0x20;
    __return_storage_ptr__->type_ = *(type *)(lVar2 + 0x10 + lVar3);
  }
  else {
    if (0xc < index) {
      return __return_storage_ptr__;
    }
    uVar4 = uVar4 >> ((char)index * '\x05' & 0x3fU);
    __return_storage_ptr__->type_ = (type)uVar4 & (custom_type|pointer_type);
    if ((uVar4 & 0x1f) == 0) {
      return __return_storage_ptr__;
    }
    lVar2 = *(long *)(this + 8);
    lVar3 = (long)index << 4;
  }
  sVar1 = ((longlong *)(lVar2 + lVar3))[1];
  (__return_storage_ptr__->value_).field_0.long_long_value = *(longlong *)(lVar2 + lVar3);
  (__return_storage_ptr__->value_).field_0.string.size = sVar1;
  return __return_storage_ptr__;
}

Assistant:

format_arg do_get(int index) const {
    format_arg arg;
    if (!is_packed()) {
      auto num_args = max_size();
      if (index < num_args) arg = args_[index];
      return arg;
    }
    if (index > internal::max_packed_args) return arg;
    arg.type_ = type(index);
    if (arg.type_ == internal::none_type) return arg;
    internal::value<Context>& val = arg.value_;
    val = values_[index];
    return arg;
  }